

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_boolNot_bvec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<bool,_3> res;
  Vector<bool,_3> res_1;
  Vector<float,_3> res_2;
  float local_34 [7];
  int local_18 [6];
  
  local_34[0] = c->in[0].m_data[2];
  local_34[1] = c->in[0].m_data[0];
  local_34[2] = c->in[0].m_data[1];
  local_34[5] = 0.0;
  local_34[3] = 0.0;
  local_34[4] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar1 = 0;
  do {
    res.m_data[lVar1] =
         local_34[lVar1 + 3] <= local_34[lVar1] && local_34[lVar1] != local_34[lVar1 + 3];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[2] = false;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = (bool)(res.m_data[lVar1] ^ 1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = (float)(int)res_1.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[local_18[lVar1]] = *(float *)((long)&res + lVar1 * 4);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }